

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void P_DoDeferedScripts(void)

{
  int script;
  acsdefered_t *paVar1;
  bool bVar2;
  ScriptPtr *code;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  AActor *who;
  long lVar6;
  long lVar7;
  long lVar8;
  FString local_40;
  FBehavior *module;
  
  uVar3 = ((level.info)->deferred).Count;
  uVar5 = uVar3 - 1;
  if (-1 < (int)uVar5) {
    lVar8 = (ulong)uVar5 * 0x18;
    lVar6 = (ulong)uVar5 + 1;
    do {
      paVar1 = ((level.info)->deferred).Array;
      uVar3 = *(uint *)((long)paVar1->args + lVar8 + -8);
      if (uVar3 < 2) {
        script = *(int *)((long)paVar1->args + lVar8 + -4);
        code = FBehavior::StaticFindScript(script,&module);
        if (code == (ScriptPtr *)0x0) {
          ScriptPresentation((int)&local_40);
          Printf("P_DoDeferredScripts: Unknown %s\n",local_40.Chars);
          goto LAB_003c34e6;
        }
        uVar4 = (ulong)*(uint *)((long)paVar1->args + lVar8 + 0xc);
        if ((uVar4 < 8) && (playeringame[uVar4] == true)) {
          who = (AActor *)(&players)[uVar4 * 0x54];
        }
        else {
          who = (AActor *)0x0;
        }
        P_GetScriptGoing(who,(line_t_conflict *)0x0,script,code,module,
                         (int *)((long)paVar1->args + lVar8),3,(uint)(uVar3 == 1) * 2);
      }
      else {
        if (uVar3 == 2) {
          SetScriptState(*(int *)((long)paVar1->args + lVar8 + -4),SCRIPT_Suspended);
          ScriptPresentation((int)&local_40);
          DPrintf(4,"Deferred suspend of %s\n",local_40.Chars);
        }
        else {
          if (uVar3 != 3) goto LAB_003c34ee;
          SetScriptState(*(int *)((long)paVar1->args + lVar8 + -4),SCRIPT_PleaseRemove);
          ScriptPresentation((int)&local_40);
          DPrintf(4,"Deferred terminate of %s\n",local_40.Chars);
        }
LAB_003c34e6:
        FString::~FString(&local_40);
      }
LAB_003c34ee:
      lVar8 = lVar8 + -0x18;
      lVar7 = lVar6 + -1;
      bVar2 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar2);
    uVar3 = ((level.info)->deferred).Count;
  }
  if (uVar3 != 0) {
    ((level.info)->deferred).Count = 0;
  }
  return;
}

Assistant:

void P_DoDeferedScripts ()
{
	const ScriptPtr *scriptdata;
	FBehavior *module;

	// Handle defered scripts in this step, too
	for(int i = level.info->deferred.Size()-1; i>=0; i--)
	{
		acsdefered_t *def = &level.info->deferred[i];
		switch (def->type)
		{
		case acsdefered_t::defexecute:
		case acsdefered_t::defexealways:
			scriptdata = FBehavior::StaticFindScript (def->script, module);
			if (scriptdata)
			{
				P_GetScriptGoing ((unsigned)def->playernum < MAXPLAYERS &&
					playeringame[def->playernum] ? players[def->playernum].mo : NULL,
					NULL, def->script,
					scriptdata, module,
					def->args, 3,
					def->type == acsdefered_t::defexealways ? ACS_ALWAYS : 0);
			}
			else
			{
				Printf ("P_DoDeferredScripts: Unknown %s\n", ScriptPresentation(def->script).GetChars());
			}
			break;

		case acsdefered_t::defsuspend:
			SetScriptState (def->script, DLevelScript::SCRIPT_Suspended);
			DPrintf (DMSG_SPAMMY, "Deferred suspend of %s\n", ScriptPresentation(def->script).GetChars());
			break;

		case acsdefered_t::defterminate:
			SetScriptState (def->script, DLevelScript::SCRIPT_PleaseRemove);
			DPrintf (DMSG_SPAMMY, "Deferred terminate of %s\n", ScriptPresentation(def->script).GetChars());
			break;
		}
	}
	level.info->deferred.Clear();
}